

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_whitelist_sign
              (secp256k1_context *ctx,secp256k1_whitelist_signature *sig,
              secp256k1_pubkey *online_pubkeys,secp256k1_pubkey *offline_pubkeys,size_t n_keys,
              secp256k1_pubkey *sub_pubkey,uchar *online_seckey,uchar *summed_seckey,size_t index,
              secp256k1_nonce_function noncefp,void *noncedata)

{
  uchar *e0;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  byte bVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  uchar *puVar37;
  size_t sVar38;
  void *pvVar39;
  int iVar40;
  undefined4 extraout_EAX;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  long lVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  uint uVar59;
  uchar *b32;
  secp256k1_scalar *r;
  undefined1 auVar60 [16];
  int overflow_1;
  secp256k1_nonce_function local_a128;
  secp256k1_whitelist_signature *local_a120;
  uchar msg32 [32];
  size_t n_keys_local;
  int overflow;
  undefined1 auStack_a0b4 [12];
  undefined1 local_a0a8 [16];
  secp256k1_scalar local_a098;
  secp256k1_scalar local_a078;
  secp256k1_scalar non;
  secp256k1_scalar s [256];
  secp256k1_gej pubs [256];
  
  sVar38 = index;
  local_a128 = nonce_function_rfc6979;
  if (noncefp != (secp256k1_nonce_function)0x0) {
    local_a128 = noncefp;
  }
  n_keys_local = n_keys;
  if ((ctx->ecmult_ctx).pre_g == (secp256k1_ge_storage_0_ *)0x0) {
    secp256k1_whitelist_sign_cold_10();
  }
  else if ((ctx->ecmult_gen_ctx).prec == (secp256k1_ge_storage (*) [64] [16])0x0) {
    secp256k1_whitelist_sign_cold_9();
  }
  else if (sig == (secp256k1_whitelist_signature *)0x0) {
    secp256k1_whitelist_sign_cold_8();
  }
  else if (online_pubkeys == (secp256k1_pubkey *)0x0) {
    secp256k1_whitelist_sign_cold_7();
  }
  else if (offline_pubkeys == (secp256k1_pubkey *)0x0) {
    secp256k1_whitelist_sign_cold_6();
  }
  else if (n_keys < 0x101) {
    if (sub_pubkey == (secp256k1_pubkey *)0x0) {
      secp256k1_whitelist_sign_cold_4();
    }
    else if (online_seckey == (uchar *)0x0) {
      secp256k1_whitelist_sign_cold_3();
    }
    else if (summed_seckey == (uchar *)0x0) {
      secp256k1_whitelist_sign_cold_2();
    }
    else if (index < n_keys) {
      iVar40 = secp256k1_whitelist_compute_keys_and_message
                         (ctx,msg32,pubs,online_pubkeys,offline_pubkeys,(int)n_keys,sub_pubkey);
      if (iVar40 == 0) {
        return 0;
      }
      auVar36._12_4_ = 0;
      auVar36._0_12_ = auStack_a0b4;
      _overflow = auVar36 << 0x20;
      secp256k1_scalar_set_b32(&local_a078,summed_seckey,&overflow);
      if ((overflow == 0) &&
         ((local_a078.d[3] != 0 || local_a078.d[1] != 0) ||
          (local_a078.d[2] != 0 || local_a078.d[0] != 0))) {
        secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx,(secp256k1_gej *)s,&local_a078);
        iVar40 = secp256k1_whitelist_hash_pubkey(&non,(secp256k1_gej *)s);
        if (iVar40 != 0) {
          auVar1._8_8_ = 0;
          auVar1._0_8_ = local_a078.d[0];
          auVar17._8_8_ = 0;
          auVar17._0_8_ = non.d[0];
          uVar42 = SUB168(auVar1 * auVar17,8);
          auVar35._8_8_ = 0;
          auVar35._0_8_ = uVar42;
          s[0].d[0] = SUB168(auVar1 * auVar17,0);
          auVar2._8_8_ = 0;
          auVar2._0_8_ = local_a078.d[0];
          auVar18._8_8_ = 0;
          auVar18._0_8_ = non.d[1];
          auVar2 = auVar2 * auVar18;
          uVar48 = SUB168(auVar2 + auVar35,0);
          uVar53 = SUB168(auVar2 + auVar35,8);
          auVar3._8_8_ = 0;
          auVar3._0_8_ = local_a078.d[1];
          auVar19._8_8_ = 0;
          auVar19._0_8_ = non.d[0];
          uVar43 = SUB168(auVar3 * auVar19,8);
          uVar41 = SUB168(auVar3 * auVar19,0);
          s[0].d[1] = uVar48 + uVar41;
          uVar41 = (ulong)CARRY8(uVar48,uVar41);
          uVar48 = uVar53 + uVar43;
          uVar54 = uVar48 + uVar41;
          uVar55 = (ulong)CARRY8(auVar2._8_8_,(ulong)CARRY8(uVar42,auVar2._0_8_)) +
                   (ulong)(CARRY8(uVar53,uVar43) || CARRY8(uVar48,uVar41));
          auVar4._8_8_ = 0;
          auVar4._0_8_ = local_a078.d[0];
          auVar20._8_8_ = 0;
          auVar20._0_8_ = non.d[2];
          uVar44 = SUB168(auVar4 * auVar20,8);
          uVar41 = SUB168(auVar4 * auVar20,0);
          uVar42 = uVar54 + uVar41;
          uVar41 = (ulong)CARRY8(uVar54,uVar41);
          uVar43 = uVar55 + uVar44;
          uVar56 = uVar43 + uVar41;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = local_a078.d[1];
          auVar21._8_8_ = 0;
          auVar21._0_8_ = non.d[1];
          uVar45 = SUB168(auVar5 * auVar21,8);
          uVar48 = SUB168(auVar5 * auVar21,0);
          uVar54 = uVar42 + uVar48;
          uVar48 = (ulong)CARRY8(uVar42,uVar48);
          uVar53 = uVar56 + uVar45;
          uVar57 = uVar53 + uVar48;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = local_a078.d[2];
          auVar22._8_8_ = 0;
          auVar22._0_8_ = non.d[0];
          uVar46 = SUB168(auVar6 * auVar22,8);
          uVar42 = SUB168(auVar6 * auVar22,0);
          s[0].d[2] = uVar54 + uVar42;
          uVar42 = (ulong)CARRY8(uVar54,uVar42);
          uVar54 = uVar57 + uVar46;
          uVar58 = uVar54 + uVar42;
          uVar49 = (ulong)(CARRY8(uVar55,uVar44) || CARRY8(uVar43,uVar41)) +
                   (ulong)(CARRY8(uVar56,uVar45) || CARRY8(uVar53,uVar48)) +
                   (ulong)(CARRY8(uVar57,uVar46) || CARRY8(uVar54,uVar42));
          auVar7._8_8_ = 0;
          auVar7._0_8_ = local_a078.d[0];
          auVar23._8_8_ = 0;
          auVar23._0_8_ = non.d[3];
          uVar46 = SUB168(auVar7 * auVar23,8);
          uVar41 = SUB168(auVar7 * auVar23,0);
          uVar42 = uVar58 + uVar41;
          uVar41 = (ulong)CARRY8(uVar58,uVar41);
          uVar53 = uVar49 + uVar46;
          uVar58 = uVar53 + uVar41;
          auVar8._8_8_ = 0;
          auVar8._0_8_ = local_a078.d[1];
          auVar24._8_8_ = 0;
          auVar24._0_8_ = non.d[2];
          uVar55 = SUB168(auVar8 * auVar24,8);
          uVar48 = SUB168(auVar8 * auVar24,0);
          uVar43 = uVar42 + uVar48;
          uVar48 = (ulong)CARRY8(uVar42,uVar48);
          uVar54 = uVar58 + uVar55;
          uVar50 = uVar54 + uVar48;
          auVar9._8_8_ = 0;
          auVar9._0_8_ = local_a078.d[2];
          auVar25._8_8_ = 0;
          auVar25._0_8_ = non.d[1];
          uVar56 = SUB168(auVar9 * auVar25,8);
          uVar42 = SUB168(auVar9 * auVar25,0);
          uVar45 = uVar43 + uVar42;
          uVar42 = (ulong)CARRY8(uVar43,uVar42);
          uVar44 = uVar50 + uVar56;
          uVar51 = uVar44 + uVar42;
          auVar10._8_8_ = 0;
          auVar10._0_8_ = local_a078.d[3];
          auVar26._8_8_ = 0;
          auVar26._0_8_ = non.d[0];
          uVar57 = SUB168(auVar10 * auVar26,8);
          uVar43 = SUB168(auVar10 * auVar26,0);
          s[0].d[3] = uVar45 + uVar43;
          uVar43 = (ulong)CARRY8(uVar45,uVar43);
          uVar45 = uVar51 + uVar57;
          uVar52 = uVar45 + uVar43;
          uVar55 = (ulong)(CARRY8(uVar49,uVar46) || CARRY8(uVar53,uVar41)) +
                   (ulong)(CARRY8(uVar58,uVar55) || CARRY8(uVar54,uVar48)) +
                   (ulong)(CARRY8(uVar50,uVar56) || CARRY8(uVar44,uVar42)) +
                   (ulong)(CARRY8(uVar51,uVar57) || CARRY8(uVar45,uVar43));
          auVar11._8_8_ = 0;
          auVar11._0_8_ = local_a078.d[1];
          auVar27._8_8_ = 0;
          auVar27._0_8_ = non.d[3];
          uVar44 = SUB168(auVar11 * auVar27,8);
          uVar41 = SUB168(auVar11 * auVar27,0);
          uVar42 = uVar52 + uVar41;
          uVar41 = (ulong)CARRY8(uVar52,uVar41);
          uVar43 = uVar55 + uVar44;
          uVar56 = uVar43 + uVar41;
          auVar12._8_8_ = 0;
          auVar12._0_8_ = local_a078.d[2];
          auVar28._8_8_ = 0;
          auVar28._0_8_ = non.d[2];
          uVar45 = SUB168(auVar12 * auVar28,8);
          uVar48 = SUB168(auVar12 * auVar28,0);
          uVar54 = uVar42 + uVar48;
          uVar48 = (ulong)CARRY8(uVar42,uVar48);
          uVar53 = uVar56 + uVar45;
          uVar57 = uVar53 + uVar48;
          auVar13._8_8_ = 0;
          auVar13._0_8_ = local_a078.d[3];
          auVar29._8_8_ = 0;
          auVar29._0_8_ = non.d[1];
          uVar46 = SUB168(auVar13 * auVar29,8);
          uVar42 = SUB168(auVar13 * auVar29,0);
          s[1].d[0] = uVar54 + uVar42;
          uVar42 = (ulong)CARRY8(uVar54,uVar42);
          uVar54 = uVar57 + uVar46;
          uVar49 = uVar54 + uVar42;
          uVar44 = (ulong)(CARRY8(uVar55,uVar44) || CARRY8(uVar43,uVar41)) +
                   (ulong)(CARRY8(uVar56,uVar45) || CARRY8(uVar53,uVar48)) +
                   (ulong)(CARRY8(uVar57,uVar46) || CARRY8(uVar54,uVar42));
          auVar14._8_8_ = 0;
          auVar14._0_8_ = local_a078.d[2];
          auVar30._8_8_ = 0;
          auVar30._0_8_ = non.d[3];
          uVar53 = SUB168(auVar14 * auVar30,8);
          uVar41 = SUB168(auVar14 * auVar30,0);
          uVar43 = uVar49 + uVar41;
          uVar41 = (ulong)CARRY8(uVar49,uVar41);
          uVar42 = uVar44 + uVar53;
          uVar45 = uVar42 + uVar41;
          auVar15._8_8_ = 0;
          auVar15._0_8_ = local_a078.d[3];
          auVar31._8_8_ = 0;
          auVar31._0_8_ = non.d[2];
          uVar54 = SUB168(auVar15 * auVar31,8);
          uVar48 = SUB168(auVar15 * auVar31,0);
          s[1].d[1] = uVar43 + uVar48;
          uVar48 = (ulong)CARRY8(uVar43,uVar48);
          uVar43 = uVar45 + uVar54;
          auVar33._8_8_ =
               (ulong)(CARRY8(uVar44,uVar53) || CARRY8(uVar42,uVar41)) +
               (ulong)(CARRY8(uVar45,uVar54) || CARRY8(uVar43,uVar48));
          auVar33._0_8_ = uVar43 + uVar48;
          auVar16._8_8_ = 0;
          auVar16._0_8_ = local_a078.d[3];
          auVar32._8_8_ = 0;
          auVar32._0_8_ = non.d[3];
          s[1].d._16_16_ = auVar16 * auVar32 + auVar33;
          local_a120 = sig;
          secp256k1_scalar_reduce_512(&local_a078,s[0].d);
          secp256k1_scalar_set_b32(&local_a098,online_seckey,&overflow);
          pvVar39 = noncedata;
          if ((overflow == 0) &&
             ((local_a098.d[3] != 0 || local_a098.d[1] != 0) ||
              (local_a098.d[2] != 0 || local_a098.d[0] != 0))) {
            secp256k1_scalar_add(&local_a078,&local_a078,&local_a098);
            overflow_1 = 0;
            secp256k1_scalar_get_b32((uchar *)&local_a098,&local_a078);
            uVar59 = 0;
            iVar40 = (*local_a128)((uchar *)&overflow,msg32,(uchar *)&local_a098,(uchar *)0x0,
                                   pvVar39,0);
            if (iVar40 != 0) {
              e0 = local_a120->data;
              puVar37 = local_a120->data;
              do {
                secp256k1_scalar_set_b32(&non,(uchar *)&overflow,&overflow_1);
                local_a0a8 = (undefined1  [16])0x0;
                _overflow = (undefined1  [16])0x0;
                if ((overflow_1 == 0) &&
                   ((non.d[3] != 0 || non.d[1] != 0) || (non.d[2] != 0 || non.d[0] != 0))) {
                  lVar47 = 1;
                  r = s;
                  b32 = puVar37;
                  do {
                    b32 = b32 + 0x20;
                    if (lVar47 - n_keys == 1) {
                      local_a120->n_keys = n_keys;
                      iVar40 = secp256k1_borromean_sign
                                         (&ctx->ecmult_ctx,&ctx->ecmult_gen_ctx,e0,s,pubs,&non,
                                          &local_a078,&n_keys_local,&index,1,msg32,0x20);
                      secp256k1_scalar_get_b32(e0 + sVar38 * 0x20 + 0x20,s + sVar38);
                      return iVar40;
                    }
                    msg32[0] = msg32[0] ^ (byte)lVar47;
                    bVar34 = (byte)((ulong)lVar47 >> 8);
                    msg32[1] = msg32[1] ^ bVar34;
                    iVar40 = (*local_a128)(b32,msg32,(uchar *)&local_a098,(uchar *)0x0,noncedata,
                                           uVar59);
                    if (iVar40 == 0) {
                      return 0;
                    }
                    secp256k1_scalar_set_b32(r,b32,&overflow_1);
                    msg32[0] = msg32[0] ^ (byte)lVar47;
                    msg32[1] = msg32[1] ^ bVar34;
                    if (overflow_1 != 0) break;
                    auVar60._0_4_ = -(uint)((int)r->d[0] == 0 && (int)r->d[2] == 0);
                    auVar60._4_4_ =
                         -(uint)(*(int *)((long)r->d + 4) == 0 && *(int *)((long)r->d + 0x14) == 0);
                    auVar60._8_4_ = -(uint)((int)r->d[1] == 0 && (int)r->d[3] == 0);
                    auVar60._12_4_ =
                         -(uint)(*(int *)((long)r->d + 0xc) == 0 && *(int *)((long)r->d + 0x1c) == 0
                                );
                    iVar40 = movmskps(extraout_EAX,auVar60);
                    lVar47 = lVar47 + 1;
                    r = r + 1;
                  } while (iVar40 != 0xf);
                }
                uVar59 = uVar59 + 1;
                iVar40 = (*local_a128)((uchar *)&overflow,msg32,(uchar *)&local_a098,(uchar *)0x0,
                                       noncedata,uVar59);
              } while (iVar40 != 0);
            }
          }
        }
      }
    }
    else {
      secp256k1_whitelist_sign_cold_1();
    }
  }
  else {
    secp256k1_whitelist_sign_cold_5();
  }
  return 0;
}

Assistant:

int secp256k1_whitelist_sign(const secp256k1_context* ctx, secp256k1_whitelist_signature *sig, const secp256k1_pubkey *online_pubkeys, const secp256k1_pubkey *offline_pubkeys, const size_t n_keys, const secp256k1_pubkey *sub_pubkey, const unsigned char *online_seckey, const unsigned char *summed_seckey, const size_t index, secp256k1_nonce_function noncefp, const void *noncedata) {
    secp256k1_gej pubs[MAX_KEYS];
    secp256k1_scalar s[MAX_KEYS];
    secp256k1_scalar sec, non;
    unsigned char msg32[32];
    int ret;

    if (noncefp == NULL) {
        noncefp = secp256k1_nonce_function_default;
    }

    /* Sanity checks */
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx));
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(sig != NULL);
    ARG_CHECK(online_pubkeys != NULL);
    ARG_CHECK(offline_pubkeys != NULL);
    ARG_CHECK(n_keys <= MAX_KEYS);
    ARG_CHECK(sub_pubkey != NULL);
    ARG_CHECK(online_seckey != NULL);
    ARG_CHECK(summed_seckey != NULL);
    ARG_CHECK(index < n_keys);

    /* Compute pubkeys: online_pubkey + tweaked(offline_pubkey + address), and message */
    ret = secp256k1_whitelist_compute_keys_and_message(ctx, msg32, pubs, online_pubkeys, offline_pubkeys, n_keys, sub_pubkey);

    /* Compute signing key: online_seckey + tweaked(summed_seckey) */
    if (ret) {
        ret = secp256k1_whitelist_compute_tweaked_privkey(ctx, &sec, online_seckey, summed_seckey);
    }
    /* Compute nonce and random s-values */
    if (ret) {
        unsigned char seckey32[32];
        unsigned int count = 0;
        int overflow = 0;

        secp256k1_scalar_get_b32(seckey32, &sec);
        while (1) {
            size_t i;
            unsigned char nonce32[32];
            int done;
            ret = noncefp(nonce32, msg32, seckey32, NULL, (void*)noncedata, count);
            if (!ret) {
                break;
            }
            secp256k1_scalar_set_b32(&non, nonce32, &overflow);
            memset(nonce32, 0, 32);
            if (overflow || secp256k1_scalar_is_zero(&non)) {
                count++;
                continue;
            }
            done = 1;
            for (i = 0; i < n_keys; i++) {
                msg32[0] ^= i + 1;
                msg32[1] ^= (i + 1) / 0x100;
                ret = noncefp(&sig->data[32 * (i + 1)], msg32, seckey32, NULL, (void*)noncedata, count);
                if (!ret) {
                    break;
                }
                secp256k1_scalar_set_b32(&s[i], &sig->data[32 * (i + 1)], &overflow);
                msg32[0] ^= i + 1;
                msg32[1] ^= (i + 1) / 0x100;
                if (overflow || secp256k1_scalar_is_zero(&s[i])) {
                    count++;
                    done = 0;
                    break;
                }
            }
            if (done) {
                break;
            }
        }
        memset(seckey32, 0, 32);
    }
    /* Actually sign */
    if (ret) {
        sig->n_keys = n_keys;
        ret = secp256k1_borromean_sign(&ctx->ecmult_ctx, &ctx->ecmult_gen_ctx, &sig->data[0], s, pubs, &non, &sec, &n_keys, &index, 1, msg32, 32);
        /* Signing will change s[index], so update in the sig structure */
        secp256k1_scalar_get_b32(&sig->data[32 * (index + 1)], &s[index]);
    }

    secp256k1_scalar_clear(&non);
    secp256k1_scalar_clear(&sec);
    return ret;
}